

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  LogMessage *this_00;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffef0;
  LogMessage local_d8;
  byte local_99;
  LogMessage local_98;
  byte local_49;
  int local_c;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_49 = 0;
  local_c = in_ESI;
  if (*(int *)(in_RDI + 0x1c) < 1) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    local_49 = 1;
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x44b12f);
  }
  local_99 = 0;
  if (*(int *)(in_RDI + 0x1c) < local_c) {
    in_stack_fffffffffffffef0 = &local_98;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    local_99 = 1;
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x44b1be);
  }
  if (local_c < 0) {
    this_00 = &local_d8;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)this_00,in_stack_fffffffffffffedc);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogMessage::~LogMessage((LogMessage *)0x44b234);
  }
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) - local_c;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  return;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  GOOGLE_CHECK_LE(count, last_returned_size_);
  GOOGLE_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}